

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

void FillDistancesPrices(CLzmaEnc *p)

{
  undefined8 uVar1;
  UInt32 (*paUVar2) [64];
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  UInt32 *pUVar14;
  CLzmaProb *pCVar15;
  UInt32 *pUVar16;
  uint uVar17;
  ulong uVar18;
  int aiStack_238 [4];
  undefined8 auStack_228 [63];
  
  p->matchPriceCount = 0;
  uVar6 = 2;
  do {
    iVar4 = (p->g_FastPos[uVar6] >> 1) - 1;
    bVar3 = (byte)iVar4;
    uVar9 = (p->g_FastPos[uVar6] & 1 | 2) << (bVar3 & 0x1f);
    iVar13 = 0;
    iVar12 = 0;
    if (iVar4 == 0) {
      uVar5 = 1;
    }
    else {
      uVar10 = 1;
      uVar5 = uVar6 & 0xffffffff;
      do {
        uVar17 = (uint)uVar5 & 1;
        uVar18 = (ulong)uVar10;
        uVar10 = uVar17 + uVar10 * 2;
        uVar5 = uVar5 >> 1;
        iVar13 = iVar13 + p->ProbPrices
                          [(-uVar17 & 0x7f0 ^ (uint)p->posEncoders[(ulong)uVar9 * 2 + uVar18]) >> 4]
        ;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      uVar5 = (ulong)uVar10;
      iVar12 = iVar13;
    }
    uVar10 = uVar9 + (int)uVar6;
    uVar9 = p->posEncoders[(ulong)uVar9 * 2 + uVar5] >> 2 & 0xfffffffc;
    aiStack_238[uVar10] = *(int *)((long)p->ProbPrices + (ulong)uVar9) + iVar12;
    aiStack_238[uVar10 + (1 << (bVar3 & 0x1f))] =
         iVar12 + *(int *)((long)p->ProbPrices + (ulong)(uVar9 ^ 0x1fc));
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x40);
  uVar9 = p->distTableSize + 1;
  pUVar14 = p->posSlotPrices[0] + 1;
  pCVar15 = p->posSlotEncoder[0] + 0x20;
  pUVar16 = p->posSlotPrices[0] + 0xe;
  lVar8 = 0;
  lVar11 = 0;
  do {
    if (1 < uVar9) {
      uVar6 = 0;
      do {
        uVar10 = (uint)uVar6;
        uVar17 = uVar10 + 0x20;
        iVar12 = p->ProbPrices
                 [((int)(uVar10 << 0x1e) >> 0x1f & 0x7f0U ^
                  (uint)p->posSlotEncoder[lVar11][uVar17 >> 2]) >> 4] +
                 p->ProbPrices
                 [(-(uVar10 & 1) & 0x7f0 ^
                  (uint)*(ushort *)((long)p->posSlotEncoder[lVar11] + (ulong)(uVar17 & 0xfffffffe)))
                  >> 4] + p->ProbPrices
                          [((int)(uVar10 << 0x1d) >> 0x1f & 0x7f0U ^
                           (uint)*(ushort *)
                                  ((long)p->posSlotEncoder[lVar11] +
                                  (ulong)(uVar17 >> 2 & 0xfffffffe))) >> 4] +
                 p->ProbPrices
                 [((int)(uVar10 << 0x1c) >> 0x1f & 0x7f0U ^
                  (uint)p->posSlotEncoder[lVar11][uVar17 >> 4]) >> 4] +
                 p->ProbPrices
                 [((int)(uVar10 << 0x1b) >> 0x1f & 0x7f0U ^
                  (uint)*(ushort *)
                         ((long)p->posSlotEncoder[lVar11] + (ulong)(uVar17 >> 4 & 0xfffffffe))) >> 4
                 ];
        uVar10 = pCVar15[uVar6] >> 2 & 0xfffffffc;
        pUVar14[uVar6 * 2 + -1] = *(int *)((long)p->ProbPrices + (ulong)uVar10) + iVar12;
        pUVar14[uVar6 * 2] = iVar12 + *(int *)((long)p->ProbPrices + (ulong)(uVar10 ^ 0x1fc));
        uVar6 = uVar6 + 1;
      } while (uVar9 >> 1 != uVar6);
      if (0xf < uVar9) {
        iVar12 = 0x20;
        lVar7 = 0;
        do {
          *(ulong *)(pUVar16 + lVar7 * 2) =
               CONCAT44(iVar12 + (int)((ulong)*(undefined8 *)(pUVar16 + lVar7 * 2) >> 0x20),
                        iVar12 + (int)*(undefined8 *)(pUVar16 + lVar7 * 2));
          iVar12 = iVar12 + 0x10;
          lVar7 = lVar7 + 1;
        } while ((ulong)(uVar9 >> 1) - 7 != lVar7);
      }
    }
    paUVar2 = p->posSlotPrices + lVar11;
    uVar1 = *(undefined8 *)(*paUVar2 + 2);
    *(undefined8 *)p->distancesPrices[lVar11] = *(undefined8 *)*paUVar2;
    *(undefined8 *)(p->distancesPrices[lVar11] + 2) = uVar1;
    lVar7 = 0;
    do {
      uVar1 = *(undefined8 *)((long)auStack_228 + lVar7 * 4);
      *(ulong *)((long)p->distancesPrices[0] + lVar7 * 4 + lVar8 + 0x10) =
           CONCAT44((*paUVar2)[p->g_FastPos[lVar7 + 4]] + (int)((ulong)uVar1 >> 0x20),
                    (*paUVar2)[p->g_FastPos[lVar7 + 4]] + (int)uVar1);
      uVar6 = lVar7 + 4;
      lVar7 = lVar7 + 2;
    } while (uVar6 < 0x7e);
    lVar11 = lVar11 + 1;
    pUVar14 = pUVar14 + 0x40;
    pCVar15 = pCVar15 + 0x40;
    pUVar16 = pUVar16 + 0x40;
    lVar8 = lVar8 + 0x200;
  } while (lVar11 != 4);
  return;
}

Assistant:

Z7_NO_INLINE static void FillDistancesPrices(CLzmaEnc *p)
{
  // int y; for (y = 0; y < 100; y++) {

  UInt32 tempPrices[kNumFullDistances];
  unsigned i, lps;

  const CProbPrice *ProbPrices = p->ProbPrices;
  p->matchPriceCount = 0;

  for (i = kStartPosModelIndex / 2; i < kNumFullDistances / 2; i++)
  {
    unsigned posSlot = GetPosSlot1(i);
    unsigned footerBits = (posSlot >> 1) - 1;
    unsigned base = ((2 | (posSlot & 1)) << footerBits);
    const CLzmaProb *probs = p->posEncoders + (size_t)base * 2;
    // tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base, footerBits, i - base, p->ProbPrices);
    UInt32 price = 0;
    unsigned m = 1;
    unsigned sym = i;
    unsigned offset = (unsigned)1 << footerBits;
    base += i;
    
    if (footerBits)
    do
    {
      unsigned bit = sym & 1;
      sym >>= 1;
      price += GET_PRICEa(probs[m], bit);
      m = (m << 1) + bit;
    }
    while (--footerBits);

    {
      unsigned prob = probs[m];
      tempPrices[base         ] = price + GET_PRICEa_0(prob);
      tempPrices[base + offset] = price + GET_PRICEa_1(prob);
    }
  }

  for (lps = 0; lps < kNumLenToPosStates; lps++)
  {
    unsigned slot;
    unsigned distTableSize2 = (p->distTableSize + 1) >> 1;
    UInt32 *posSlotPrices = p->posSlotPrices[lps];
    const CLzmaProb *probs = p->posSlotEncoder[lps];
    
    for (slot = 0; slot < distTableSize2; slot++)
    {
      // posSlotPrices[slot] = RcTree_GetPrice(encoder, kNumPosSlotBits, slot, p->ProbPrices);
      UInt32 price;
      unsigned bit;
      unsigned sym = slot + (1 << (kNumPosSlotBits - 1));
      unsigned prob;
      bit = sym & 1; sym >>= 1; price  = GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      bit = sym & 1; sym >>= 1; price += GET_PRICEa(probs[sym], bit);
      prob = probs[(size_t)slot + (1 << (kNumPosSlotBits - 1))];
      posSlotPrices[(size_t)slot * 2    ] = price + GET_PRICEa_0(prob);
      posSlotPrices[(size_t)slot * 2 + 1] = price + GET_PRICEa_1(prob);
    }
    
    {
      UInt32 delta = ((UInt32)((kEndPosModelIndex / 2 - 1) - kNumAlignBits) << kNumBitPriceShiftBits);
      for (slot = kEndPosModelIndex / 2; slot < distTableSize2; slot++)
      {
        posSlotPrices[(size_t)slot * 2    ] += delta;
        posSlotPrices[(size_t)slot * 2 + 1] += delta;
        delta += ((UInt32)1 << kNumBitPriceShiftBits);
      }
    }

    {
      UInt32 *dp = p->distancesPrices[lps];
      
      dp[0] = posSlotPrices[0];
      dp[1] = posSlotPrices[1];
      dp[2] = posSlotPrices[2];
      dp[3] = posSlotPrices[3];

      for (i = 4; i < kNumFullDistances; i += 2)
      {
        UInt32 slotPrice = posSlotPrices[GetPosSlot1(i)];
        dp[i    ] = slotPrice + tempPrices[i];
        dp[i + 1] = slotPrice + tempPrices[i + 1];
      }
    }
  }
  // }
}